

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_grid_mesh.h
# Opt level: O3

LBBox3fa * __thiscall
embree::avx2::GridMeshISA::vlinearBounds
          (LBBox3fa *__return_storage_ptr__,GridMeshISA *this,size_t buildID,BBox1f *time_range,
          SubGridBuildData *sgrids)

{
  float fVar1;
  ushort uVar2;
  ushort uVar3;
  long lVar4;
  size_t sVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  undefined4 uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  undefined1 (*pauVar15) [16];
  long lVar16;
  long lVar17;
  ushort uVar18;
  ulong uVar19;
  ushort uVar20;
  ulong uVar21;
  BufferView<embree::Vec3fa> *pBVar22;
  BufferView<embree::Vec3fa> *pBVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  float fVar37;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar38;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar36;
  float fVar45;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar46;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar44;
  undefined1 auVar47 [16];
  float fVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [64];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [64];
  undefined1 auVar67 [16];
  
  uVar19 = (ulong)sgrids[buildID].sx & 0x7fff;
  uVar11 = (ulong)sgrids[buildID].sy & 0x7fff;
  lVar4 = *(long *)&(this->super_GridMesh).super_Geometry.field_0x58;
  lVar17 = (ulong)sgrids[buildID].primID * *(long *)&(this->super_GridMesh).field_0x68;
  fVar1 = (this->super_GridMesh).super_Geometry.fnumTimeSegments;
  fVar24 = (this->super_GridMesh).super_Geometry.time_range.lower;
  fVar48 = (this->super_GridMesh).super_Geometry.time_range.upper - fVar24;
  fVar28 = (time_range->lower - fVar24) / fVar48;
  fVar48 = (time_range->upper - fVar24) / fVar48;
  fVar24 = fVar1 * fVar28;
  fVar25 = fVar1 * fVar48;
  auVar52 = vroundss_avx(ZEXT416((uint)fVar24),ZEXT416((uint)fVar24),9);
  auVar32 = vroundss_avx(ZEXT416((uint)fVar25),ZEXT416((uint)fVar25),10);
  auVar35 = vmaxss_avx(auVar52,ZEXT816(0));
  fVar33 = auVar35._0_4_;
  iVar14 = -1;
  if (-1 < (int)auVar52._0_4_) {
    iVar14 = (int)auVar52._0_4_;
  }
  iVar6 = (int)fVar1 + 1;
  if ((int)auVar32._0_4_ < (int)fVar1 + 1) {
    iVar6 = (int)auVar32._0_4_;
  }
  auVar35 = vminss_avx(auVar32,ZEXT416((uint)fVar1));
  fVar37 = auVar35._0_4_;
  uVar2 = *(ushort *)(lVar4 + 10 + lVar17);
  uVar21 = (ulong)uVar2;
  if (uVar11 + 3 < (ulong)uVar2) {
    uVar21 = uVar11 + 3;
  }
  uVar20 = (ushort)uVar11;
  uVar18 = (ushort)uVar19;
  if (uVar20 < uVar2) {
    lVar7 = (long)(int)fVar33;
    uVar13 = uVar19 + 3;
    uVar3 = *(ushort *)(lVar4 + 8 + lVar17);
    uVar10 = (ulong)uVar3;
    if (uVar13 < uVar3) {
      uVar10 = uVar13;
    }
    pBVar22 = (this->super_GridMesh).vertices.items;
    pBVar23 = pBVar22 + lVar7;
    auVar65._8_4_ = 0x7f800000;
    auVar65._0_8_ = 0x7f8000007f800000;
    auVar65._12_4_ = 0x7f800000;
    auVar39._8_4_ = 0xff800000;
    auVar39._0_8_ = 0xff800000ff800000;
    auVar39._12_4_ = 0xff800000;
    auVar62._8_4_ = 0xddccb9a2;
    auVar62._0_8_ = 0xddccb9a2ddccb9a2;
    auVar62._12_4_ = 0xddccb9a2;
    auVar63._8_4_ = 0x5dccb9a2;
    auVar63._0_8_ = 0x5dccb9a25dccb9a2;
    auVar63._12_4_ = 0x5dccb9a2;
    auVar54 = ZEXT1664(auVar39);
    auVar57 = ZEXT1664(auVar65);
    uVar12 = uVar11;
    do {
      if (uVar18 < uVar3) {
        sVar5 = (pBVar23->super_RawBufferView).stride;
        pauVar15 = (undefined1 (*) [16])
                   ((pBVar23->super_RawBufferView).ptr_ofs +
                   (*(uint *)(lVar4 + lVar17) + uVar19 + *(uint *)(lVar4 + 4 + lVar17) * uVar12) *
                   sVar5);
        lVar16 = uVar10 - uVar19;
        do {
          auVar32 = *pauVar15;
          auVar35 = vcmpps_avx(auVar32,auVar62,6);
          auVar52 = vcmpps_avx(auVar32,auVar63,1);
          auVar35 = vandps_avx(auVar35,auVar52);
          uVar9 = vmovmskps_avx(auVar35);
          auVar35 = auVar65;
          auVar52 = auVar39;
          if ((~(byte)uVar9 & 7) != 0) goto LAB_01991db0;
          auVar35 = vminps_avx(auVar57._0_16_,auVar32);
          auVar57 = ZEXT1664(auVar35);
          auVar35 = vmaxps_avx(auVar54._0_16_,auVar32);
          auVar54 = ZEXT1664(auVar35);
          pauVar15 = (undefined1 (*) [16])(*pauVar15 + sVar5);
          lVar16 = lVar16 + -1;
        } while (lVar16 != 0);
      }
      auVar52 = auVar54._0_16_;
      auVar35 = auVar57._0_16_;
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar21);
LAB_01991db0:
    lVar16 = (long)(int)fVar37;
    pBVar22 = pBVar22 + lVar16;
    auVar54 = ZEXT1664(auVar39);
    auVar57 = ZEXT1664(auVar65);
    uVar12 = uVar11;
    do {
      if (uVar18 < uVar3) {
        sVar5 = (pBVar22->super_RawBufferView).stride;
        pauVar15 = (undefined1 (*) [16])
                   ((pBVar22->super_RawBufferView).ptr_ofs +
                   (*(uint *)(lVar4 + lVar17) + uVar19 + *(uint *)(lVar4 + 4 + lVar17) * uVar12) *
                   sVar5);
        lVar8 = uVar10 - uVar19;
        do {
          auVar32 = *pauVar15;
          auVar42 = vcmpps_avx(auVar32,auVar62,6);
          auVar60 = vcmpps_avx(auVar32,auVar63,1);
          auVar42 = vandps_avx(auVar42,auVar60);
          uVar9 = vmovmskps_avx(auVar42);
          auVar60 = auVar65;
          auVar58 = auVar39;
          if ((~(byte)uVar9 & 7) != 0) goto LAB_01991e3a;
          auVar42 = vminps_avx(auVar57._0_16_,auVar32);
          auVar57 = ZEXT1664(auVar42);
          auVar32 = vmaxps_avx(auVar54._0_16_,auVar32);
          auVar54 = ZEXT1664(auVar32);
          pauVar15 = (undefined1 (*) [16])(*pauVar15 + sVar5);
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
      }
      auVar58 = auVar54._0_16_;
      auVar60 = auVar57._0_16_;
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar21);
LAB_01991e3a:
    if (iVar6 - iVar14 != 1) {
      if (uVar20 < uVar2) {
        uVar3 = *(ushort *)(lVar4 + 8 + lVar17);
        uVar10 = (ulong)uVar3;
        if (uVar13 < uVar3) {
          uVar10 = uVar13;
        }
        pBVar23 = (this->super_GridMesh).vertices.items;
        auVar30._8_4_ = 0x7f800000;
        auVar30._0_8_ = 0x7f8000007f800000;
        auVar30._12_4_ = 0x7f800000;
        auVar54 = ZEXT1664(auVar30);
        auVar42._8_4_ = 0xff800000;
        auVar42._0_8_ = 0xff800000ff800000;
        auVar42._12_4_ = 0xff800000;
        auVar57 = ZEXT1664(auVar42);
        auVar66 = ZEXT1664(auVar30);
        uVar13 = uVar11;
        do {
          if (uVar18 < uVar3) {
            sVar5 = pBVar23[lVar7 + 1].super_RawBufferView.stride;
            pauVar15 = (undefined1 (*) [16])
                       (pBVar23[lVar7 + 1].super_RawBufferView.ptr_ofs +
                       (*(uint *)(lVar4 + lVar17) + uVar19 + *(uint *)(lVar4 + 4 + lVar17) * uVar13)
                       * sVar5);
            lVar8 = uVar10 - uVar19;
            do {
              auVar32 = *pauVar15;
              auVar39 = vcmpps_avx(auVar32,auVar62,6);
              auVar65 = vcmpps_avx(auVar32,auVar63,1);
              auVar39 = vandps_avx(auVar65,auVar39);
              uVar9 = vmovmskps_avx(auVar39);
              auVar39 = auVar42;
              auVar65 = auVar30;
              if ((~(byte)uVar9 & 7) != 0) goto LAB_01991fcb;
              auVar39 = vminps_avx(auVar66._0_16_,auVar32);
              auVar66 = ZEXT1664(auVar39);
              auVar32 = vmaxps_avx(auVar57._0_16_,auVar32);
              auVar57 = ZEXT1664(auVar32);
              pauVar15 = (undefined1 (*) [16])(*pauVar15 + sVar5);
              lVar8 = lVar8 + -1;
            } while (lVar8 != 0);
          }
          auVar65 = auVar66._0_16_;
          auVar39 = auVar57._0_16_;
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar21);
LAB_01991fcb:
        auVar57 = ZEXT1664(auVar42);
        uVar13 = uVar11;
        do {
          if (uVar18 < uVar3) {
            sVar5 = pBVar23[lVar16 + -1].super_RawBufferView.stride;
            pauVar15 = (undefined1 (*) [16])
                       (pBVar23[lVar16 + -1].super_RawBufferView.ptr_ofs +
                       (*(uint *)(lVar4 + lVar17) + uVar19 + *(uint *)(lVar4 + 4 + lVar17) * uVar13)
                       * sVar5);
            lVar7 = uVar10 - uVar19;
            do {
              auVar32 = *pauVar15;
              auVar30 = vcmpps_avx(auVar32,auVar62,6);
              auVar50 = vcmpps_avx(auVar32,auVar63,1);
              auVar30 = vandps_avx(auVar30,auVar50);
              uVar9 = vmovmskps_avx(auVar30);
              if ((~(byte)uVar9 & 7) != 0) {
                auVar32._8_4_ = 0x7f800000;
                auVar32._0_8_ = 0x7f8000007f800000;
                auVar32._12_4_ = 0x7f800000;
                goto LAB_01992060;
              }
              auVar30 = vminps_avx(auVar54._0_16_,auVar32);
              auVar54 = ZEXT1664(auVar30);
              auVar32 = vmaxps_avx(auVar57._0_16_,auVar32);
              auVar57 = ZEXT1664(auVar32);
              pauVar15 = (undefined1 (*) [16])(*pauVar15 + sVar5);
              lVar7 = lVar7 + -1;
            } while (lVar7 != 0);
          }
          auVar32 = auVar54._0_16_;
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar21);
        auVar42 = auVar57._0_16_;
      }
      else {
        auVar32._8_4_ = 0x7f800000;
        auVar32._0_8_ = 0x7f8000007f800000;
        auVar32._12_4_ = 0x7f800000;
        auVar42._8_4_ = 0xff800000;
        auVar42._0_8_ = 0xff800000ff800000;
        auVar42._12_4_ = 0xff800000;
        auVar39 = auVar42;
        auVar65 = auVar32;
      }
LAB_01992060:
      auVar62 = vmaxss_avx(ZEXT416((uint)(fVar24 - fVar33)),ZEXT816(0) << 0x40);
      fVar33 = auVar62._0_4_;
      fVar24 = 1.0 - fVar33;
      auVar49._0_4_ = auVar65._0_4_ * fVar33;
      auVar49._4_4_ = auVar65._4_4_ * fVar33;
      auVar49._8_4_ = auVar65._8_4_ * fVar33;
      auVar49._12_4_ = auVar65._12_4_ * fVar33;
      auVar64._4_4_ = fVar24;
      auVar64._0_4_ = fVar24;
      auVar64._8_4_ = fVar24;
      auVar64._12_4_ = fVar24;
      auVar50 = vfmadd231ps_fma(auVar49,auVar64,auVar35);
      auVar51._0_4_ = auVar39._0_4_ * fVar33;
      auVar51._4_4_ = auVar39._4_4_ * fVar33;
      auVar51._8_4_ = auVar39._8_4_ * fVar33;
      auVar51._12_4_ = auVar39._12_4_ * fVar33;
      auVar52 = vfmadd231ps_fma(auVar51,auVar64,auVar52);
      auVar35 = vmaxss_avx(ZEXT416((uint)(fVar37 - fVar25)),ZEXT816(0) << 0x40);
      fVar25 = auVar35._0_4_;
      fVar24 = 1.0 - fVar25;
      auVar35._0_4_ = fVar25 * auVar32._0_4_;
      auVar35._4_4_ = fVar25 * auVar32._4_4_;
      auVar35._8_4_ = fVar25 * auVar32._8_4_;
      auVar35._12_4_ = fVar25 * auVar32._12_4_;
      auVar55._4_4_ = fVar24;
      auVar55._0_4_ = fVar24;
      auVar55._8_4_ = fVar24;
      auVar55._12_4_ = fVar24;
      aVar36 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd231ps_fma(auVar35,auVar55,auVar60);
      auVar43._0_4_ = fVar25 * auVar42._0_4_;
      auVar43._4_4_ = fVar25 * auVar42._4_4_;
      auVar43._8_4_ = fVar25 * auVar42._8_4_;
      auVar43._12_4_ = fVar25 * auVar42._12_4_;
      aVar44 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd231ps_fma(auVar43,auVar55,auVar58);
      if ((int)(iVar14 + 1U) < iVar6) {
        uVar13 = (ulong)(iVar14 + 1U);
        auVar53._8_4_ = 0x7f800000;
        auVar53._0_8_ = 0x7f8000007f800000;
        auVar53._12_4_ = 0x7f800000;
        auVar56._8_4_ = 0xff800000;
        auVar56._0_8_ = 0xff800000ff800000;
        auVar56._12_4_ = 0xff800000;
        auVar59._8_4_ = 0xddccb9a2;
        auVar59._0_8_ = 0xddccb9a2ddccb9a2;
        auVar59._12_4_ = 0xddccb9a2;
        auVar61._8_4_ = 0x5dccb9a2;
        auVar61._0_8_ = 0x5dccb9a25dccb9a2;
        auVar61._12_4_ = 0x5dccb9a2;
        auVar35 = auVar50;
        auVar32 = auVar52;
        do {
          auVar52 = auVar53;
          auVar42 = auVar56;
          if (uVar20 < uVar2) {
            uVar3 = *(ushort *)(lVar4 + 8 + lVar17);
            uVar10 = (ulong)uVar3;
            if (uVar19 + 3 < (ulong)uVar3) {
              uVar10 = uVar19 + 3;
            }
            pBVar23 = (this->super_GridMesh).vertices.items + uVar13;
            auVar54 = ZEXT1664(auVar56);
            auVar57 = ZEXT1664(auVar53);
            uVar12 = uVar11;
            do {
              if (uVar18 < uVar3) {
                sVar5 = (pBVar23->super_RawBufferView).stride;
                pauVar15 = (undefined1 (*) [16])
                           ((pBVar23->super_RawBufferView).ptr_ofs +
                           (*(uint *)(lVar4 + lVar17) + uVar19 +
                           *(uint *)(lVar4 + 4 + lVar17) * uVar12) * sVar5);
                lVar7 = uVar10 - uVar19;
                do {
                  auVar39 = *pauVar15;
                  auVar52 = vcmpps_avx(auVar39,auVar59,6);
                  auVar42 = vcmpps_avx(auVar39,auVar61,1);
                  auVar52 = vandps_avx(auVar52,auVar42);
                  uVar9 = vmovmskps_avx(auVar52);
                  auVar52 = auVar53;
                  auVar42 = auVar56;
                  if ((~(byte)uVar9 & 7) != 0) goto LAB_019921c8;
                  auVar52 = vminps_avx(auVar57._0_16_,auVar39);
                  auVar57 = ZEXT1664(auVar52);
                  auVar52 = vmaxps_avx(auVar54._0_16_,auVar39);
                  auVar54 = ZEXT1664(auVar52);
                  pauVar15 = (undefined1 (*) [16])(*pauVar15 + sVar5);
                  lVar7 = lVar7 + -1;
                } while (lVar7 != 0);
              }
              auVar42 = auVar54._0_16_;
              auVar52 = auVar57._0_16_;
              uVar12 = uVar12 + 1;
            } while (uVar12 != uVar21);
          }
LAB_019921c8:
          fVar25 = ((float)(int)uVar13 / fVar1 - fVar28) / (fVar48 - fVar28);
          fVar24 = 1.0 - fVar25;
          auVar67._0_4_ = aVar36.m128[0] * fVar25;
          fVar33 = aVar36.m128[1];
          auVar67._4_4_ = fVar33 * fVar25;
          fVar37 = aVar36.m128[2];
          auVar67._8_4_ = fVar37 * fVar25;
          fVar38 = aVar36.m128[3];
          auVar67._12_4_ = fVar38 * fVar25;
          auVar31._4_4_ = fVar24;
          auVar31._0_4_ = fVar24;
          auVar31._8_4_ = fVar24;
          auVar31._12_4_ = fVar24;
          auVar39 = vfmadd231ps_fma(auVar67,auVar31,auVar35);
          auVar52 = vsubps_avx(auVar52,auVar39);
          auVar27._0_4_ = aVar44.m128[0] * fVar25;
          fVar24 = aVar44.m128[1];
          auVar27._4_4_ = fVar24 * fVar25;
          fVar45 = aVar44.m128[2];
          auVar27._8_4_ = fVar45 * fVar25;
          fVar46 = aVar44.m128[3];
          auVar27._12_4_ = fVar46 * fVar25;
          auVar39 = vfmadd231ps_fma(auVar27,auVar32,auVar31);
          auVar42 = vsubps_avx(auVar42,auVar39);
          auVar52 = vminps_avx(auVar52,ZEXT416(0) << 0x20);
          auVar42 = vmaxps_avx(auVar42,ZEXT416(0) << 0x20);
          auVar50._0_4_ = auVar35._0_4_ + auVar52._0_4_;
          auVar50._4_4_ = auVar35._4_4_ + auVar52._4_4_;
          auVar50._8_4_ = auVar35._8_4_ + auVar52._8_4_;
          auVar50._12_4_ = auVar35._12_4_ + auVar52._12_4_;
          aVar36._0_4_ = aVar36.m128[0] + auVar52._0_4_;
          aVar36._4_4_ = fVar33 + auVar52._4_4_;
          aVar36._8_4_ = fVar37 + auVar52._8_4_;
          aVar36._12_4_ = fVar38 + auVar52._12_4_;
          auVar52._0_4_ = auVar32._0_4_ + auVar42._0_4_;
          auVar52._4_4_ = auVar32._4_4_ + auVar42._4_4_;
          auVar52._8_4_ = auVar32._8_4_ + auVar42._8_4_;
          auVar52._12_4_ = auVar32._12_4_ + auVar42._12_4_;
          aVar44._0_4_ = aVar44.m128[0] + auVar42._0_4_;
          aVar44._4_4_ = fVar24 + auVar42._4_4_;
          aVar44._8_4_ = fVar45 + auVar42._8_4_;
          aVar44._12_4_ = fVar46 + auVar42._12_4_;
          uVar13 = uVar13 + 1;
          auVar35 = auVar50;
          auVar32 = auVar52;
        } while (iVar6 != (int)uVar13);
      }
      *(undefined1 (*) [16])(__return_storage_ptr__->bounds0).lower.field_0.m128 = auVar50;
      *(undefined1 (*) [16])(__return_storage_ptr__->bounds0).upper.field_0.m128 = auVar52;
      goto LAB_0199223a;
    }
  }
  else {
    auVar60._8_4_ = 0x7f800000;
    auVar60._0_8_ = 0x7f8000007f800000;
    auVar60._12_4_ = 0x7f800000;
    auVar58._8_4_ = 0xff800000;
    auVar58._0_8_ = 0xff800000ff800000;
    auVar58._12_4_ = 0xff800000;
    auVar35 = auVar60;
    auVar52 = auVar58;
    auVar32 = auVar60;
    auVar42 = auVar58;
    auVar39 = auVar58;
    auVar65 = auVar60;
    if (iVar6 - iVar14 != 1) goto LAB_01992060;
  }
  auVar32 = vmaxss_avx(ZEXT416((uint)(fVar24 - fVar33)),ZEXT816(0) << 0x40);
  fVar24 = auVar32._0_4_;
  fVar1 = 1.0 - fVar24;
  auVar47._0_4_ = auVar60._0_4_ * fVar24;
  auVar47._4_4_ = auVar60._4_4_ * fVar24;
  auVar47._8_4_ = auVar60._8_4_ * fVar24;
  auVar47._12_4_ = auVar60._12_4_ * fVar24;
  auVar40._4_4_ = fVar1;
  auVar40._0_4_ = fVar1;
  auVar40._8_4_ = fVar1;
  auVar40._12_4_ = fVar1;
  aVar36 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd231ps_fma(auVar47,auVar40,auVar35);
  auVar26._0_4_ = auVar58._0_4_ * fVar24;
  auVar26._4_4_ = auVar58._4_4_ * fVar24;
  auVar26._8_4_ = auVar58._8_4_ * fVar24;
  auVar26._12_4_ = auVar58._12_4_ * fVar24;
  aVar44 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd231ps_fma(auVar26,auVar52,auVar40);
  (__return_storage_ptr__->bounds0).lower.field_0 = aVar36;
  (__return_storage_ptr__->bounds0).upper.field_0 = aVar44;
  auVar32 = vmaxss_avx(ZEXT416((uint)(fVar37 - fVar25)),ZEXT816(0) << 0x40);
  fVar24 = auVar32._0_4_;
  fVar1 = 1.0 - fVar24;
  auVar34._0_4_ = auVar35._0_4_ * fVar24;
  auVar34._4_4_ = auVar35._4_4_ * fVar24;
  auVar34._8_4_ = auVar35._8_4_ * fVar24;
  auVar34._12_4_ = auVar35._12_4_ * fVar24;
  auVar29._4_4_ = fVar1;
  auVar29._0_4_ = fVar1;
  auVar29._8_4_ = fVar1;
  auVar29._12_4_ = fVar1;
  aVar36 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd231ps_fma(auVar34,auVar29,auVar60);
  auVar41._0_4_ = fVar24 * auVar52._0_4_;
  auVar41._4_4_ = fVar24 * auVar52._4_4_;
  auVar41._8_4_ = fVar24 * auVar52._8_4_;
  auVar41._12_4_ = fVar24 * auVar52._12_4_;
  aVar44 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd231ps_fma(auVar41,auVar29,auVar58);
LAB_0199223a:
  (__return_storage_ptr__->bounds1).lower.field_0 = aVar36;
  (__return_storage_ptr__->bounds1).upper.field_0 = aVar44;
  return __return_storage_ptr__;
}

Assistant:

LBBox3fa vlinearBounds(size_t buildID, const BBox1f& time_range, const SubGridBuildData * const sgrids) const override {
        const SubGridBuildData &subgrid = sgrids[buildID];                      
        const unsigned int primID = subgrid.primID;
        const size_t x = subgrid.x();
        const size_t y = subgrid.y();
        return linearBounds(grid(primID),x,y,time_range);
      }